

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O3

int lj_cf_unpack(lua_State *L)

{
  cTValue *pcVar1;
  uint key;
  MSize MVar2;
  int iVar3;
  TValue *pTVar4;
  cTValue *pcVar5;
  TValue *pTVar6;
  int size;
  long lVar7;
  GCtab *t;
  
  pTVar4 = L->base;
  pTVar6 = L->top;
  if ((pTVar6 <= pTVar4) || ((pTVar4->field_2).it != 0xfffffff4)) {
    lj_err_argt(L,1,5);
  }
  t = (GCtab *)(ulong)(pTVar4->u32).lo;
  key = 1;
  if ((pTVar4 + 1 < pTVar6) && (*(int *)((long)pTVar4 + 0xc) != -1)) {
    key = lj_lib_checkint(L,2);
    pTVar4 = L->base;
    pTVar6 = L->top;
  }
  if ((pTVar4 + 2 < pTVar6) && (*(int *)((long)pTVar4 + 0x14) != -1)) {
    MVar2 = lj_lib_checkint(L,3);
  }
  else {
    MVar2 = lj_tab_len(t);
  }
  if ((int)key <= (int)MVar2) {
    if (-1 < (int)(MVar2 - key)) {
      size = (MVar2 - key) + 1;
      iVar3 = lua_checkstack(L,size);
      if (iVar3 != 0) {
        lVar7 = (long)(int)key << 3;
        do {
          if (key < t->asize) {
            pcVar5 = (cTValue *)((ulong)(t->array).ptr32 + lVar7);
          }
          else {
            pcVar5 = lj_tab_getinth(t,key);
          }
          pcVar1 = L->top;
          L->top = pcVar1 + 1;
          if (pcVar5 == (cTValue *)0x0) {
            (pcVar1->field_2).it = 0xffffffff;
          }
          else {
            *pcVar1 = *pcVar5;
          }
          lVar7 = lVar7 + 8;
          key = key + 1;
        } while (MVar2 + 1 != key);
        return size;
      }
    }
    lj_err_caller(L,LJ_ERR_UNPACK);
  }
  return 0;
}

Assistant:

LJLIB_CF(unpack)
{
  GCtab *t = lj_lib_checktab(L, 1);
  int32_t n, i = lj_lib_optint(L, 2, 1);
  int32_t e = (L->base+3-1 < L->top && !tvisnil(L->base+3-1)) ?
	      lj_lib_checkint(L, 3) : (int32_t)lj_tab_len(t);
  if (i > e) return 0;
  n = e - i + 1;
  if (n <= 0 || !lua_checkstack(L, n))
    lj_err_caller(L, LJ_ERR_UNPACK);
  do {
    cTValue *tv = lj_tab_getint(t, i);
    if (tv) {
      copyTV(L, L->top++, tv);
    } else {
      setnilV(L->top++);
    }
  } while (i++ < e);
  return n;
}